

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

void __thiscall
ON_SimpleArray<ON_SubDEdgePtr>::Prepend
          (ON_SimpleArray<ON_SubDEdgePtr> *this,int count,ON_SubDEdgePtr *buffer)

{
  size_t sz;
  ON_SubDEdgePtr *__dest;
  int iVar1;
  ON_SubDEdgePtr *__dest_00;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDEdgePtr *pOVar3;
  long lVar4;
  int iVar5;
  
  if (buffer != (ON_SubDEdgePtr *)0x0 && 0 < count) {
    sz = (ulong)(uint)count * 8;
    iVar5 = this->m_count;
    if (this->m_capacity < iVar5 + count) {
      iVar1 = NewCapacity(this);
      iVar5 = count + this->m_count;
      if (iVar5 < iVar1) {
        iVar5 = iVar1;
      }
      __dest_00 = (ON_SubDEdgePtr *)0x0;
      if ((this->m_a <= buffer) && (buffer < this->m_a + this->m_capacity)) {
        __dest_00 = (ON_SubDEdgePtr *)onmalloc(sz);
        memcpy(__dest_00,buffer,sz);
        buffer = __dest_00;
      }
      Reserve(this,(long)iVar5);
      iVar5 = this->m_count;
    }
    else {
      __dest_00 = (ON_SubDEdgePtr *)0x0;
    }
    lVar4 = (ulong)(uint)count + (long)iVar5;
    __dest = this->m_a;
    pOVar3 = __dest + lVar4;
    for (pOVar2 = __dest + iVar5; pOVar3 = pOVar3 + -1, __dest < pOVar2; pOVar2 = pOVar2 + -1) {
      pOVar3->m_ptr = pOVar2[-1].m_ptr;
    }
    memcpy(__dest,buffer,sz);
    if (__dest_00 != (ON_SubDEdgePtr *)0x0) {
      onfree(__dest_00);
    }
    this->m_count = (int)lVar4;
  }
  return;
}

Assistant:

void ON_SimpleArray<T>::Prepend( int count, const T* buffer ) 
{
  if ( count > 0 && nullptr != buffer ) 
  {
    const size_t sizeof_buffer = count * sizeof(T);
    void* temp = nullptr;
    if ( count + m_count > m_capacity ) 
    {
      int newcapacity = NewCapacity();
      if ( newcapacity < count + m_count )
        newcapacity = count + m_count;
      if ( buffer >= m_a && buffer < (m_a + m_capacity) )
      {
        // buffer is in the block of memory about to be reallocated
        temp = onmalloc(sizeof_buffer);
        memcpy(temp, buffer, sizeof_buffer);
        buffer = (const T*)temp;
      }
      Reserve( newcapacity );
    }

    const size_t count0 = (size_t)m_count;
    const size_t count1 = count0 + ((size_t)count);
    T* p0 = m_a;
    T* p = p0 + count0;
    T* p1 = m_a + count1;
    while (p > p0)
      *(--p1) = *(--p);
    memcpy( (void*)(m_a), (void*)(buffer), sizeof_buffer );
    if (nullptr != temp)
      onfree(temp);
    m_count = (int)count1;
  }
}